

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::NullTypeHandlerBase::GetProperty
          (NullTypeHandlerBase *this,DynamicObject *instance,Var originalInstance,
          PropertyId propertyId,Var *value,PropertyValueInfo *info,ScriptContext *requestContext)

{
  bool bVar1;
  BOOL BVar2;
  ScriptContext *this_00;
  RecyclableObject *pRVar3;
  ScriptContext *scriptContext;
  PropertyValueInfo *pPStack_40;
  uint32 indexVal;
  PropertyValueInfo *info_local;
  Var *value_local;
  Var pvStack_28;
  PropertyId propertyId_local;
  Var originalInstance_local;
  DynamicObject *instance_local;
  NullTypeHandlerBase *this_local;
  
  pPStack_40 = info;
  info_local = (PropertyValueInfo *)value;
  value_local._4_4_ = propertyId;
  pvStack_28 = originalInstance;
  originalInstance_local = instance;
  instance_local = (DynamicObject *)this;
  this_00 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  bVar1 = DynamicObject::HasObjectArray((DynamicObject *)originalInstance_local);
  if ((bVar1) &&
     (BVar2 = ScriptContext::IsNumericPropertyId
                        (this_00,value_local._4_4_,(uint32 *)((long)&scriptContext + 4)), BVar2 != 0
     )) {
    this_local._4_4_ =
         DynamicTypeHandler::GetItem
                   (&this->super_DynamicTypeHandler,(DynamicObject *)originalInstance_local,
                    pvStack_28,scriptContext._4_4_,&info_local->m_instance,requestContext);
  }
  else {
    pRVar3 = ScriptContext::GetMissingPropertyResult(requestContext);
    info_local->m_instance = pRVar3;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL NullTypeHandlerBase::GetProperty(DynamicObject* instance, Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        // Check numeric propertyId only if objectArray is available
        uint32 indexVal;
        ScriptContext* scriptContext = instance->GetScriptContext();
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return DynamicTypeHandler::GetItem(instance, originalInstance, indexVal, value, requestContext);
        }

        *value = requestContext->GetMissingPropertyResult();
        return false;
    }